

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O0

int find_nal_unit(uint8_t *buf,int size,int *nal_start,int *nal_end)

{
  int iVar1;
  bool bVar2;
  int local_34;
  int i;
  int *nal_end_local;
  int *nal_start_local;
  int size_local;
  uint8_t *buf_local;
  
  *nal_start = 0;
  *nal_end = 0;
  local_34 = 0;
  while( true ) {
    if (((((buf[local_34] != '\0') || (buf[local_34 + 1] != '\0')) ||
         (bVar2 = false, buf[local_34 + 2] != '\x01')) &&
        ((bVar2 = true, buf[local_34] == '\0' && (bVar2 = true, buf[local_34 + 1] == '\0')))) &&
       (bVar2 = true, buf[local_34 + 2] == '\0')) {
      bVar2 = buf[local_34 + 3] != '\x01';
    }
    if (!bVar2) break;
    iVar1 = local_34 + 5;
    local_34 = local_34 + 1;
    if (size <= iVar1) {
      return 0;
    }
  }
  if (((buf[local_34] != '\0') || (buf[local_34 + 1] != '\0')) || (buf[local_34 + 2] != '\x01')) {
    local_34 = local_34 + 1;
  }
  if (((buf[local_34] == '\0') && (buf[local_34 + 1] == '\0')) && (buf[local_34 + 2] == '\x01')) {
    *nal_start = local_34 + 3;
    local_34 = local_34 + 3;
    while( true ) {
      if ((((buf[local_34] != '\0') || (buf[local_34 + 1] != '\0')) ||
          (bVar2 = false, buf[local_34 + 2] != '\0')) &&
         ((bVar2 = true, buf[local_34] == '\0' && (bVar2 = true, buf[local_34 + 1] == '\0')))) {
        bVar2 = buf[local_34 + 2] != '\x01';
      }
      if (!bVar2) break;
      iVar1 = local_34 + 4;
      local_34 = local_34 + 1;
      if (size <= iVar1) {
        *nal_end = size;
        return -1;
      }
    }
    *nal_end = local_34;
    return *nal_end - *nal_start;
  }
  return 0;
}

Assistant:

int find_nal_unit(uint8_t* buf, int size, int* nal_start, int* nal_end)
{
    int i;
    // find start
    *nal_start = 0;
    *nal_end = 0;

    i = 0;
    while (   //( next_bits( 24 ) != 0x000001 && next_bits( 32 ) != 0x00000001 )
            (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0x01) &&
            (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0 || buf[i+3] != 0x01)
            )
    {
        i++; // skip leading zero
        if (i+4 >= size) { return 0; } // did not find nal start
    }

    if  (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0x01) // ( next_bits( 24 ) != 0x000001 )
    {
        i++;
    }

    if  (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0x01) { /* error, should never happen */ return 0; }
    i+= 3;
    *nal_start = i;

    while (   //( next_bits( 24 ) != 0x000000 && next_bits( 24 ) != 0x000001 )
            (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0) &&
            (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0x01)
            )
    {
        i++;
        // FIXME the next line fails when reading a nal that ends exactly at the end of the data
        if (i+3 >= size) { *nal_end = size; return -1; } // did not find nal end, stream ended first
    }

    *nal_end = i;
    return (*nal_end - *nal_start);
}